

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

ApplVerID * FIX::Message::toApplVerID(ApplVerID *__return_storage_ptr__,BeginString *value)

{
  bool bVar1;
  string *value_00;
  allocator<char> local_161;
  STRING local_160;
  allocator<char> local_139;
  STRING local_138;
  allocator<char> local_111;
  STRING local_110;
  allocator<char> local_e9;
  STRING local_e8;
  allocator<char> local_c1;
  STRING local_c0;
  allocator<char> local_99;
  STRING local_98;
  allocator<char> local_71;
  STRING local_70;
  allocator<char> local_39;
  STRING local_38;
  StringField *local_18;
  BeginString *value_local;
  
  local_18 = &value->super_StringField;
  value_local = (BeginString *)__return_storage_ptr__;
  bVar1 = FIX::operator==(&value->super_StringField,"FIX.4.0");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"2",&local_39);
    ApplVerID::ApplVerID(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    bVar1 = FIX::operator==(local_18,"FIX.4.1");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"3",&local_71);
      ApplVerID::ApplVerID(__return_storage_ptr__,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    else {
      bVar1 = FIX::operator==(local_18,"FIX.4.2");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"4",&local_99);
        ApplVerID::ApplVerID(__return_storage_ptr__,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
      }
      else {
        bVar1 = FIX::operator==(local_18,"FIX.4.3");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"5",&local_c1);
          ApplVerID::ApplVerID(__return_storage_ptr__,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
        }
        else {
          bVar1 = FIX::operator==(local_18,"FIX.4.4");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"6",&local_e9);
            ApplVerID::ApplVerID(__return_storage_ptr__,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::allocator<char>::~allocator(&local_e9);
          }
          else {
            bVar1 = FIX::operator==(local_18,"FIX.5.0");
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"7",&local_111);
              ApplVerID::ApplVerID(__return_storage_ptr__,&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              std::allocator<char>::~allocator(&local_111);
            }
            else {
              bVar1 = FIX::operator==(local_18,"FIX.5.0SP1");
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_138,"8",&local_139);
                ApplVerID::ApplVerID(__return_storage_ptr__,&local_138);
                std::__cxx11::string::~string((string *)&local_138);
                std::allocator<char>::~allocator(&local_139);
              }
              else {
                bVar1 = FIX::operator==(local_18,"FIX.5.0SP2");
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_160,"9",&local_161);
                  ApplVerID::ApplVerID(__return_storage_ptr__,&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                  std::allocator<char>::~allocator(&local_161);
                }
                else {
                  value_00 = StringField::operator_cast_to_string_(local_18);
                  ApplVerID::ApplVerID(__return_storage_ptr__,value_00);
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ApplVerID toApplVerID(const BeginString& value)
  {
    if( value == BeginString_FIX40 )
      return ApplVerID(ApplVerID_FIX40);
    if( value == BeginString_FIX41 )
      return ApplVerID(ApplVerID_FIX41);
    if( value == BeginString_FIX42 )
      return ApplVerID(ApplVerID_FIX42);
    if( value == BeginString_FIX43 )
      return ApplVerID(ApplVerID_FIX43);
    if( value == BeginString_FIX44 )
      return ApplVerID(ApplVerID_FIX44);
    if( value == BeginString_FIX50 )
      return ApplVerID(ApplVerID_FIX50);
    if( value == "FIX.5.0SP1" )
      return ApplVerID(ApplVerID_FIX50SP1);
    if( value == "FIX.5.0SP2" )
      return ApplVerID(ApplVerID_FIX50SP2);
    return ApplVerID(ApplVerID(value));
  }